

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhash.c
# Opt level: O0

int rhash_file_update(rhash ctx,FILE *fd)

{
  int iVar1;
  int *piVar2;
  void *pvVar3;
  size_t length_00;
  int local_54;
  int res;
  size_t align8;
  size_t length;
  uchar *pmem;
  uchar *buffer;
  size_t block_size;
  rhash_context_ext *ectx;
  FILE *fd_local;
  rhash ctx_local;
  
  local_54 = 0;
  if (ctx[1].hash_id == 0xb01dbabe) {
    if (ctx == (rhash)0x0) {
      piVar2 = __errno_location();
      *piVar2 = 0x16;
      ctx_local._4_4_ = -1;
    }
    else {
      pvVar3 = malloc(0x2008);
      if (pvVar3 == (void *)0x0) {
        ctx_local._4_4_ = -1;
      }
      else {
        pvVar3 = (void *)((long)pvVar3 + (-(long)pvVar3 & 7U));
        while( true ) {
          iVar1 = feof((FILE *)fd);
          if ((iVar1 != 0) || (ctx[1].hash_id != 0xb01dbabe)) goto LAB_00882314;
          length_00 = fread(pvVar3,1,0x2000,(FILE *)fd);
          iVar1 = ferror((FILE *)fd);
          if (iVar1 != 0) break;
          if ((length_00 != 0) && (rhash_update(ctx,pvVar3,length_00), ctx[2].msg_size != 0)) {
            (*(code *)ctx[2].msg_size)(*(undefined8 *)&ctx[2].hash_id,ctx->msg_size);
          }
        }
        local_54 = -1;
LAB_00882314:
        free(pvVar3);
        ctx_local._4_4_ = local_54;
      }
    }
  }
  else {
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

RHASH_API int rhash_file_update(rhash ctx, FILE* fd)
{
	rhash_context_ext* const ectx = (rhash_context_ext*)ctx;
	const size_t block_size = 8192;
	unsigned char *buffer, *pmem;
	size_t length = 0, align8;
	int res = 0;
	if (ectx->state != STATE_ACTIVE) return 0; /* do nothing if canceled */

	if (ctx == NULL) {
		errno = EINVAL;
		return -1;
	}

	pmem = (unsigned char*)malloc(block_size + 8);
	if (!pmem) return -1; /* errno is set to ENOMEM according to UNIX 98 */

	align8 = ((unsigned char*)0 - pmem) & 7;
	buffer = pmem + align8;

	while (!feof(fd)) {
		/* stop if canceled */
		if (ectx->state != STATE_ACTIVE) break;

		length = fread(buffer, 1, block_size, fd);

		if (ferror(fd)) {
			res = -1; /* note: errno contains error code */
			break;
		} else if (length) {
			rhash_update(ctx, buffer, length);

			if (ectx->callback) {
				((rhash_callback_t)ectx->callback)(ectx->callback_data, ectx->rc.msg_size);
			}
		}
	}

	free(buffer);
	return res;
}